

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::FindHelper<false,false>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              int64 length,Arguments *args,ScriptContext *scriptContext)

{
  code *pcVar1;
  Var pvVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  ThreadContext *pTVar6;
  Var pvVar7;
  JavascriptLibrary *pJVar8;
  RecyclableObject *pRVar9;
  undefined4 *puVar10;
  JavascriptMethod p_Var11;
  undefined4 extraout_var;
  CallInfo local_110;
  CallInfo local_108;
  undefined1 local_100 [8];
  AutoReentrancyHandler autoReentrancyHandler_1;
  Var index_1;
  uint32 k_1;
  CallInfo local_d8;
  undefined1 local_d0 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  Var index;
  uint32 k;
  Var undefined;
  int8 loopDelta;
  uint32 loopStart;
  Var testResult;
  Var element;
  RecyclableObject *pRStack_88;
  CallFlags flags;
  Var thisArg;
  RecyclableObject *callBackFn;
  undefined1 local_68 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  Arguments *args_local;
  int64 length_local;
  RecyclableObject *obj_local;
  TypedArrayBase *typedArrayBase_local;
  JavascriptArray *pArr_local;
  
  jsReentLock._24_8_ = scriptContext;
  pTVar6 = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_68,pTVar6);
  JsReentLock::setObjectForMutation((JsReentLock *)local_68,pArr);
  if ((SUB84(args->Info,0) & 0xffffff) < 2) {
LAB_010fd83b:
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      JavascriptError::ThrowTypeError
                ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec34,L"Array.prototype.find");
    }
    JavascriptError::ThrowTypeError
              ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec34,L"[TypedArray].prototype.find");
  }
  pvVar7 = Arguments::operator[](args,1);
  bVar3 = JavascriptConversion::IsCallable(pvVar7);
  if (!bVar3) goto LAB_010fd83b;
  pvVar7 = Arguments::operator[](args,1);
  thisArg = VarTo<Js::RecyclableObject>(pvVar7);
  if ((SUB84(args->Info,0) & 0xffffff) < 3) {
    pJVar8 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
    pRStack_88 = JavascriptLibraryBase::GetUndefined(&pJVar8->super_JavascriptLibraryBase);
  }
  else {
    pRStack_88 = (RecyclableObject *)Arguments::operator[](args,2);
  }
  obj_local = (RecyclableObject *)typedArrayBase;
  if (((typedArrayBase == (TypedArrayBase *)0x0) && (pArr == (JavascriptArray *)0x0)) &&
     (bVar3 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(obj), bVar3)) {
    obj_local = (RecyclableObject *)UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
  }
  element._4_4_ = CallFlags_Value;
  testResult = (Var)0x0;
  if (pArr == (JavascriptArray *)0x0) {
    if (obj_local == (RecyclableObject *)0x0) {
      JsReentLock::unlock((JsReentLock *)local_68);
      pArr_local = (JavascriptArray *)
                   FindObjectHelper<false,false>
                             (obj,length,0,(RecyclableObject *)thisArg,pRStack_88,
                              (ScriptContext *)jsReentLock._24_8_);
      goto LAB_010fe115;
    }
    if (0xffffffff < length) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2148,"(length <= 0xffffffff)","length <= UINT_MAX");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    for (index_1._0_4_ = 0; (long)(ulong)(uint)index_1 < length; index_1._0_4_ = (uint)index_1 + 1)
    {
      iVar5 = (*(obj_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x72])(obj_local,(ulong)(uint)index_1);
      testResult = (Var)CONCAT44(extraout_var,iVar5);
      autoReentrancyHandler_1._8_8_ =
           JavascriptNumber::ToVar((uint)index_1,(ScriptContext *)jsReentLock._24_8_);
      JsReentLock::unlock((JsReentLock *)local_68);
      pTVar6 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
      AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_100,pTVar6);
      pTVar6 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
      ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar6);
      pTVar6 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
      ThreadContext::AssertJsReentrancy(pTVar6);
      pvVar7 = thisArg;
      p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)thisArg);
      CheckIsExecutable((RecyclableObject *)pvVar7,p_Var11);
      p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)thisArg);
      pvVar7 = thisArg;
      CallInfo::CallInfo(&local_108,element._4_4_,4);
      pvVar2 = thisArg;
      CallInfo::CallInfo(&local_110,element._4_4_,4);
      pvVar7 = (*p_Var11)((RecyclableObject *)pvVar7,(CallInfo)pvVar2,local_108,0,0,0,0,local_110,
                          pRStack_88,testResult,autoReentrancyHandler_1._8_8_,obj_local);
      AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_100);
      JsReentLock::MutateArrayObject((JsReentLock *)local_68);
      JsReentLock::relock((JsReentLock *)local_68);
      BVar4 = JavascriptConversion::ToBoolean(pvVar7,(ScriptContext *)jsReentLock._24_8_);
      if (BVar4 != 0) {
        pArr_local = (JavascriptArray *)testResult;
        goto LAB_010fe115;
      }
    }
  }
  else {
    pJVar8 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
    pRVar9 = JavascriptLibraryBase::GetUndefined(&pJVar8->super_JavascriptLibraryBase);
    if (0xffffffff < length) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2125,"(length <= 0xffffffff)","length <= UINT_MAX");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    for (index._4_4_ = 0; (long)(ulong)index._4_4_ < length; index._4_4_ = index._4_4_ + 1) {
      testResult = pRVar9;
      JsReentLock::unlock((JsReentLock *)local_68);
      (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
        .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])
                (pArr,(ulong)index._4_4_,&testResult);
      JsReentLock::MutateArrayObject((JsReentLock *)local_68);
      JsReentLock::relock((JsReentLock *)local_68);
      autoReentrancyHandler._8_8_ =
           JavascriptNumber::ToVar(index._4_4_,(ScriptContext *)jsReentLock._24_8_);
      JsReentLock::unlock((JsReentLock *)local_68);
      pTVar6 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
      AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_d0,pTVar6);
      pTVar6 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
      ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar6);
      pTVar6 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
      ThreadContext::AssertJsReentrancy(pTVar6);
      pvVar7 = thisArg;
      p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)thisArg);
      CheckIsExecutable((RecyclableObject *)pvVar7,p_Var11);
      p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)thisArg);
      pvVar7 = thisArg;
      CallInfo::CallInfo(&local_d8,element._4_4_,4);
      pvVar2 = thisArg;
      CallInfo::CallInfo((CallInfo *)&k_1,element._4_4_,4);
      pvVar7 = (*p_Var11)((RecyclableObject *)pvVar7,(CallInfo)pvVar2,local_d8,0,0,0,0,_k_1,
                          pRStack_88,testResult,autoReentrancyHandler._8_8_,pArr);
      AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_d0);
      JsReentLock::MutateArrayObject((JsReentLock *)local_68);
      JsReentLock::relock((JsReentLock *)local_68);
      BVar4 = JavascriptConversion::ToBoolean(pvVar7,(ScriptContext *)jsReentLock._24_8_);
      if (BVar4 != 0) {
        pArr_local = (JavascriptArray *)testResult;
        goto LAB_010fe115;
      }
      bVar3 = IsNonES5Array(obj);
      if (!bVar3) {
        bVar3 = VarIs<Js::ES5Array,Js::RecyclableObject>(obj);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x2141,"(VarIs<ES5Array>(obj))",
                                      "The array should have been converted to an ES5Array");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        JsReentLock::unlock((JsReentLock *)local_68);
        pArr_local = (JavascriptArray *)
                     FindObjectHelper<false,false>
                               (obj,length,(ulong)(index._4_4_ + 1),(RecyclableObject *)thisArg,
                                pRStack_88,(ScriptContext *)jsReentLock._24_8_);
        goto LAB_010fe115;
      }
    }
  }
  pJVar8 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
  pArr_local = (JavascriptArray *)
               JavascriptLibraryBase::GetUndefined(&pJVar8->super_JavascriptLibraryBase);
LAB_010fe115:
  JsReentLock::~JsReentLock((JsReentLock *)local_68);
  return pArr_local;
}

Assistant:

Var JavascriptArray::FindHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, int64 length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            // typedArrayBase is only non-null if and only if we came here via the TypedArray entrypoint
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, findIndex ? _u("[TypedArray].prototype.findIndex") : _u("[TypedArray].prototype.find"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, findIndex ? _u("Array.prototype.findIndex") : _u("Array.prototype.find"));
            }
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        // If we came from Array.prototype.find/findIndex and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        CallFlags flags = CallFlags_Value;
        Var element = nullptr;
        Var testResult = nullptr;
        uint32 loopStart = reversed ? (uint32)length - 1 : 0;
        int8 loopDelta = reversed ? -1 : 1;

        if (pArr)
        {
            Var undefined = scriptContext->GetLibrary()->GetUndefined();

            Assert(length <= UINT_MAX);
            for (uint32 k = loopStart; k < length; k += loopDelta)
            {
                element = undefined;
                JS_REENTRANT(jsReentLock, pArr->DirectGetItemAtFull(k, &element));

                Var index = JavascriptNumber::ToVar(k, scriptContext);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(flags, 4), thisArg,
                                element,
                                index,
                                pArr);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return findIndex ? index : element;
                }

                // Side-effects in the callback function may have changed the source array into an ES5Array. If this happens
                // we will process the rest of the array elements like an ES5Array.
                if (!JavascriptArray::IsNonES5Array(obj))
                {
                    AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                    JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::FindObjectHelper<findIndex, reversed>(obj, length, k + 1, callBackFn, thisArg, scriptContext));
                }
            }
        }
        else if (typedArrayBase)
        {
            Assert(length <= UINT_MAX);
            for (uint32 k = loopStart; k < length; k+= loopDelta)
            {
                // Spec does not ask to call HasItem, so we need to go to visit the whole length

                element = typedArrayBase->DirectGetItem(k);

                Var index = JavascriptNumber::ToVar(k, scriptContext);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(flags, 4), thisArg,
                            element,
                            index,
                            typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return findIndex ? index : element;
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::FindObjectHelper<findIndex, reversed>(obj, length, 0u, callBackFn, thisArg, scriptContext));
        }

        return findIndex ? JavascriptNumber::ToVar(-1, scriptContext) : scriptContext->GetLibrary()->GetUndefined();
    }